

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseLocator_test.cpp
# Opt level: O1

void __thiscall
test::environment_var_location_not_defined::test_method(environment_var_location_not_defined *this)

{
  bool bVar1;
  AuditEvent *pAVar2;
  undefined **local_218;
  ulong local_210;
  shared_count sStack_208;
  long **local_200;
  undefined4 local_1f4;
  undefined **local_1f0;
  undefined1 local_1e8;
  undefined1 *local_1e0;
  undefined4 **local_1d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  licenseInfos;
  long local_1b8;
  long *local_1b0;
  undefined4 *local_1a8;
  undefined1 local_1a0;
  undefined8 local_198;
  shared_count sStack_190;
  EnvironmentVarLocation environmentVarLocation;
  EventRegistry registry;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined **local_50;
  undefined1 local_48;
  undefined1 *local_40;
  char *local_38;
  
  unsetenv("LICENSE_LOCATION");
  license::EventRegistry::EventRegistry(&registry);
  license::locate::EnvironmentVarLocation::EnvironmentVarLocation(&environmentVarLocation);
  license::locate::EnvironmentVarLocation::license_locations_abi_cxx11_
            (&licenseInfos,&environmentVarLocation,&registry);
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/LicenseLocator_test.cpp"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0xb6);
  bVar1 = license::EventRegistry::isGood(&registry);
  local_210 = 0;
  sStack_208.pi_ = (sp_counted_base *)0x0;
  local_1e8 = 0;
  local_1f0 = &PTR__lazy_ostream_001e2258;
  local_1e0 = boost::unit_test::lazy_ostream::inst;
  local_1d8 = (undefined4 **)0x1b335d;
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/LicenseLocator_test.cpp"
  ;
  local_88 = "";
  local_218._0_1_ = bVar1;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_208);
  license::EventRegistry::turnWarningsIntoErrors(&registry);
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/LicenseLocator_test.cpp"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0xb8);
  bVar1 = license::EventRegistry::isGood(&registry);
  local_218 = (undefined **)CONCAT71(local_218._1_7_,!bVar1);
  local_210 = 0;
  sStack_208.pi_ = (sp_counted_base *)0x0;
  local_1e8 = 0;
  local_1f0 = &PTR__lazy_ostream_001e2298;
  local_1e0 = boost::unit_test::lazy_ostream::inst;
  local_1d8 = (undefined4 **)0x1b3383;
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/LicenseLocator_test.cpp"
  ;
  local_b8 = "";
  boost::test_tools::tt_detail::report_assertion(&local_218,&local_1f0,&local_c0,0xb8,2,1,0);
  boost::detail::shared_count::~shared_count(&sStack_208);
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/LicenseLocator_test.cpp"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0xb9);
  local_1b8 = (long)licenseInfos.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)licenseInfos.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
  local_1a0 = licenseInfos.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              licenseInfos.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_48 = 0;
  local_50 = &PTR__lazy_ostream_001e2118;
  local_40 = boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  local_1a8 = &local_1f4;
  local_1f4 = 0;
  local_1b0 = &local_1b8;
  local_198 = 0;
  sStack_190.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/LicenseLocator_test.cpp"
  ;
  local_58 = "";
  local_1d8 = &local_1a8;
  local_1e8 = 0;
  local_1f0 = &PTR__lazy_ostream_001e2158;
  local_1e0 = boost::unit_test::lazy_ostream::inst;
  local_200 = &local_1b0;
  local_210 = local_210 & 0xffffffffffffff00;
  local_218 = &PTR__lazy_ostream_001e2198;
  sStack_208.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_190);
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/LicenseLocator_test.cpp"
  ;
  local_e8 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f0,0xba);
  pAVar2 = license::EventRegistry::getLastFailure(&registry);
  local_218 = (undefined **)
              CONCAT71(local_218._1_7_,pAVar2->event_type == ENVIRONMENT_VARIABLE_NOT_DEFINED);
  local_210 = 0;
  sStack_208.pi_ = (sp_counted_base *)0x0;
  local_1e8 = 0;
  local_1f0 = &PTR__lazy_ostream_001e2298;
  local_1e0 = boost::unit_test::lazy_ostream::inst;
  local_1d8 = (undefined4 **)0x1b3383;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_208);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&licenseInfos);
  license::locate::EnvironmentVarLocation::~EnvironmentVarLocation(&environmentVarLocation);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree(&registry.mostAdvancedLogIdx_by_LicenseId._M_t);
  if (registry.logs.super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer_conflict)0x0) {
    operator_delete(registry.logs.super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(environment_var_location_not_defined) {
	UNSETENV(LCC_LICENSE_LOCATION_ENV_VAR);
	license::EventRegistry registry;
	EnvironmentVarLocation environmentVarLocation;
	vector<string> licenseInfos = environmentVarLocation.license_locations(registry);

	BOOST_CHECK_MESSAGE(registry.isGood(), "No fatal error for now, only warnings");
	registry.turnWarningsIntoErrors();
	BOOST_REQUIRE_MESSAGE(!registry.isGood(), "Error detected");
	BOOST_CHECK_EQUAL(0, licenseInfos.size());
	BOOST_CHECK_MESSAGE(registry.getLastFailure()->event_type == ENVIRONMENT_VARIABLE_NOT_DEFINED, "Error detected");
}